

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O1

apx_error_t
apx_program_decode_header(uint8_t *begin,uint8_t *end,uint8_t **next,apx_programHeader_t *header)

{
  uint32_t *number;
  byte bVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  byte *pbVar5;
  byte bVar6;
  apx_error_t aVar7;
  char cVar8;
  uint8_t *puVar9;
  
  if (end == (uint8_t *)0x0 || begin == (uint8_t *)0x0) {
    return 1;
  }
  puVar9 = begin + 1;
  if ((header == (apx_programHeader_t *)0x0 || next == (uint8_t **)0x0) || end <= puVar9) {
    return 1;
  }
  header->element_size = 0;
  header->queue_length = 0;
  bVar6 = *begin;
  header->program_type = bVar6 >> 3 & 1;
  bVar1 = *begin;
  header->has_dynamic_data = (_Bool)(bVar1 >> 4 & 1);
  *next = puVar9;
  number = &header->data_size;
  pbVar5 = apx_vm_parse_uint32_by_variant(puVar9,end,bVar6 & 7,number);
  aVar7 = 3;
  if (end < pbVar5) {
    return 3;
  }
  if (pbVar5 <= *next) {
    return 3;
  }
  *next = pbVar5;
  if ((bVar1 & 0x20) == 0) {
    return 0;
  }
  if (pbVar5 < end) {
    bVar6 = *pbVar5 >> 3 & 0xf;
    bVar3 = false;
    if ((byte)(bVar6 - 0xc) < 0xf7 || (*pbVar5 & 7) != 2) goto LAB_0013405e;
    *next = pbVar5 + 1;
    cVar8 = -3;
    if (5 < bVar6) {
      cVar8 = (bVar6 < 9) * '\x03' + -9;
    }
    uVar4 = apx_vm_variant_to_size(cVar8 + bVar6);
    if (uVar4 == 0) goto LAB_0013405e;
    if (uVar4 <= *number) {
      puVar9 = apx_vm_parse_uint32_by_variant
                         (*next,end,5 < bVar6 && bVar6 < 9,&header->element_size);
      bVar3 = false;
      if ((end < puVar9) || (bVar3 = false, puVar9 <= *next)) goto LAB_0013405e;
      *next = puVar9;
      uVar2 = header->element_size;
      if (uVar2 != 0) {
        bVar3 = false;
        if ((*number - uVar4) % uVar2 == 0) {
          header->queue_length = (*number - uVar4) / uVar2;
          bVar3 = true;
        }
        else {
          aVar7 = 0x41;
        }
        goto LAB_0013405e;
      }
    }
  }
  bVar3 = false;
LAB_0013405e:
  if (bVar3) {
    return 0;
  }
  return aVar7;
}

Assistant:

apx_error_t apx_program_decode_header(uint8_t const* begin, uint8_t const* end, uint8_t const** next, apx_programHeader_t* header)
{
   if ((begin != NULL) && (end != NULL) && ((begin + UINT8_SIZE) < end) && (next != NULL) && (header != NULL))
   {
      uint8_t const* result = NULL;
      header->element_size = 0u;
      header->queue_length = 0u;
      uint8_t data_variant = begin[0] & APX_VM_HEADER_DATA_VARIANT_MASK;
      header->program_type = ((begin[0] & APX_VM_HEADER_PROG_TYPE_PACK) == APX_VM_HEADER_PROG_TYPE_PACK) ? APX_PACK_PROGRAM : APX_UNPACK_PROGRAM;
      bool const is_queued_data = ((begin[0] & APX_VM_HEADER_FLAG_QUEUED_DATA) == APX_VM_HEADER_FLAG_QUEUED_DATA);
      header->has_dynamic_data = ((begin[0] & APX_VM_HEADER_FLAG_DYNAMIC_DATA) == APX_VM_HEADER_FLAG_DYNAMIC_DATA);
      *next = begin+1;
      result = apx_vm_parse_uint32_by_variant(*next, end, data_variant, &header->data_size);
      if ((result > *next) && (result <= end))
      {
         *next = result;
      }
      else
      {
         return APX_PARSE_ERROR;
      }

      if (is_queued_data)
      {
         uint8_t opcode = 0u;
         uint8_t variant = 0u;
         bool flag = false;;
         uint8_t element_variant = 0u;
         uint8_t queued_variant = 0u;
         uint32_t queued_elem_size = 0u;
         uint32_t tmp = 0u;
         if (*next >= end)
         {
            return APX_PARSE_ERROR;
         }
         apx_program_decode_instruction(**next, &opcode, &variant, &flag);
         if ((opcode != APX_VM_OPCODE_DATA_SIZE) || (variant < APX_VM_VARIANT_ELEMENT_SIZE_U8_BASE) || (variant > APX_VM_VARIANT_ELEMENT_SIZE_LAST))
         {
            return APX_PARSE_ERROR;
         }
         (*next)++;
         if (variant < APX_VM_VARIANT_ELEMENT_SIZE_U16_BASE) //variant is between 3..5
         {
            element_variant = APX_VM_VARIANT_UINT8;
            queued_variant = variant - APX_VM_VARIANT_ELEMENT_SIZE_U8_BASE;
         }
         else if (variant < APX_VM_VARIANT_ELEMENT_SIZE_U32_BASE) //variant is between 6..8
         {
            element_variant = APX_VM_VARIANT_UINT16;
            queued_variant = variant - APX_VM_VARIANT_ELEMENT_SIZE_U16_BASE;
         }
         else //variant is between 9..11
         {
            element_variant = APX_VM_VARIANT_UINT32;
            queued_variant = variant - APX_VM_VARIANT_ELEMENT_SIZE_U32_BASE;
         }
         queued_elem_size = (uint32_t)apx_vm_variant_to_size(queued_variant);
         if ((queued_elem_size == 0u) || (queued_elem_size > header->data_size))
         {
            return APX_PARSE_ERROR;
         }
         result = apx_vm_parse_uint32_by_variant(*next, end, element_variant, &header->element_size);
         if ((result > *next) && (result <= end))
         {
            *next = result;
         }
         else
         {
            return APX_PARSE_ERROR;
         }
         //Calculate element size by subtracting queued_elem_size from header->data_size then dividing by header->element_size
         if (header->element_size == 0)
         {
            return APX_PARSE_ERROR;
         }
         tmp = header->data_size - queued_elem_size;
         if (tmp % header->element_size != 0)
         {
            return APX_INVALID_HEADER_ERROR;
         }
         header->queue_length = tmp / header->element_size;
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;

}